

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O0

MemTxResult
address_space_read_full_m68k(AddressSpace *as,hwaddr addr,MemTxAttrs attrs,void *buf,hwaddr len)

{
  FlatView *fv_00;
  FlatView *fv;
  MemTxResult result;
  hwaddr len_local;
  void *buf_local;
  hwaddr addr_local;
  AddressSpace *as_local;
  MemTxAttrs attrs_local;
  
  fv._4_4_ = 0;
  if (len != 0) {
    fv_00 = address_space_to_flatview(as);
    fv._4_4_ = flatview_read((uc_struct_conflict3 *)as->uc,fv_00,addr,attrs,buf,len);
  }
  return fv._4_4_;
}

Assistant:

MemTxResult address_space_read_full(AddressSpace *as, hwaddr addr,
                                    MemTxAttrs attrs, void *buf, hwaddr len)
{
    MemTxResult result = MEMTX_OK;
    FlatView *fv;

    if (len > 0) {
        fv = address_space_to_flatview(as);
        result = flatview_read(as->uc, fv, addr, attrs, buf, len);
    }

    return result;
}